

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O3

ostream * operator<<(ostream *os,HistogramBasedDistribution *distribution)

{
  int iVar1;
  ostream *poVar2;
  pointer ppVar3;
  int iVar4;
  char local_3c [4];
  double local_38;
  
  ppVar3 = (distribution->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar4 = -1;
  local_38 = -1.0;
  do {
    if (ppVar3 != (distribution->values).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      iVar1 = ppVar3->first;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar4);
      local_3c[0] = ' ';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c,1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,ppVar3->first + -1);
      local_3c[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 1,1);
      poVar2 = std::ostream::_M_insert<double>(local_38 * (double)(iVar1 - iVar4));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    iVar4 = ppVar3->first;
    local_38 = ppVar3->second;
    ppVar3 = ppVar3 + 1;
  } while (ppVar3 != (distribution->values).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  iVar1 = distribution->max;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar4);
  local_3c[2] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 2,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,distribution->max);
  local_3c[3] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c + 3,1);
  poVar2 = std::ostream::_M_insert<double>(local_38 * (double)((iVar1 - iVar4) + 1));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HistogramBasedDistribution& distribution) {
	vector<HistogramBasedDistribution::value_t>::const_iterator cit = distribution.values.begin();
	int start = -1;
	double p = -1.0;
	while (true) {
		if (cit != distribution.values.begin()) {
			int length = cit->first - start;
			os << start << ' ' << (cit->first-1) << ' ' << (p*length) << endl;
		}
		start = cit->first;
		p = cit->second;
		++cit;
		if (cit == distribution.values.end()) {
			int length = distribution.max - start + 1;
			os << start << ' ' << distribution.max << ' ' << (p*length) << endl;
			break;
		}
	}
	return os;
}